

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

int Gia_WinAddCiWithMaxDivisors(Gia_Man_t *p,Vec_Wec_t *vLevels)

{
  int iPivot;
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  pVVar2 = p->vCis;
  if (0 < pVVar2->nSize) {
    iVar3 = -1;
    lVar6 = 0;
    iVar4 = -1;
    do {
      iPivot = pVVar2->pArray[lVar6];
      if (((long)iPivot < 0) || (p->nObjs <= iPivot)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iPivot == 0) break;
      if (p->nTravIdsAlloc <= iPivot) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (p->pTravIds[iPivot] != p->nTravIds) {
        iVar1 = Gia_WinTryAddingNode(p,iPivot,-1,vLevels,(Vec_Int_t *)0x0);
        iVar5 = iVar4;
        if (iVar4 <= iVar1) {
          iVar5 = iVar1;
        }
        if (iVar4 < iVar1) {
          iVar3 = iPivot;
        }
        pVVar2 = p->vCis;
        iVar4 = iVar5;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar2->nSize);
    if (-1 < iVar3) {
      return iVar3;
    }
  }
  __assert_fail("iMaxFan >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                ,0x28a,"int Gia_WinAddCiWithMaxDivisors(Gia_Man_t *, Vec_Wec_t *)");
}

Assistant:

int Gia_WinAddCiWithMaxDivisors( Gia_Man_t * p, Vec_Wec_t * vLevels )
{
    int i, Id, nCurFan, nMaxFan = -1, iMaxFan = -1;
    Gia_ManForEachCiId( p, Id, i )
    {
        if ( Gia_ObjIsTravIdCurrentId( p, Id ) )
            continue;
        nCurFan = Gia_WinTryAddingNode( p, Id, -1, vLevels, NULL );
        if ( nMaxFan < nCurFan )
        {
            nMaxFan = nCurFan;
            iMaxFan = Id;
        }
    }
    assert( iMaxFan >= 0 );
    return iMaxFan;
}